

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O3

int get_physical_address
              (CPURISCVState_conflict1 *env,hwaddr *physical,int *prot,target_ulong addr,
              int access_type,int mmu_idx,_Bool first_stage,_Bool two_stage)

{
  uint64_t uVar1;
  uint uVar2;
  ulong uVar3;
  char cVar4;
  byte bVar5;
  _Bool _Var6;
  int iVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  uint64_t uVar11;
  MemoryRegion_conflict *pMVar12;
  uint64_t *puVar13;
  uint uVar14;
  target_ulong *ptVar15;
  long lVar16;
  target_ulong addr_00;
  uint uVar17;
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  target_ulong tVar21;
  uint64_t uVar22;
  target_ulong local_a0;
  hwaddr vbase;
  int local_88;
  MemTxResult res;
  ulong local_80;
  ulong local_78;
  byte *local_70;
  ulong local_68;
  ulong local_60;
  undefined8 local_58;
  hwaddr *local_50;
  ulong local_48;
  ulong local_40;
  hwaddr addr1;
  
  if (access_type == 2 || mmu_idx != 3) {
    bVar5 = 0;
    uVar17 = mmu_idx;
LAB_00c670a3:
    if ((((access_type != 2) && (uVar17 == 1)) && (uVar17 = 1, (env->misa & 0x80) != 0)) &&
       (((env->virt & 1) == 0 && ((env->hstatus & 1) != 0)))) {
      uVar17 = (uint)env->mstatus >> 8 & 1;
      bVar5 = 1;
    }
  }
  else {
    uVar3 = env->mstatus;
    if (((uint)uVar3 >> 0x11 & 1) != 0) {
      uVar17 = (uint)(uVar3 >> 0xb) & 3;
      if ((env->misa & 0x80) == 0) {
        bVar5 = 0;
      }
      else {
        bVar5 = (byte)(uint)(uVar3 >> 0x27) & 1;
      }
      goto LAB_00c670a3;
    }
    uVar17 = 3;
    bVar5 = 0;
  }
  if (!first_stage) {
    uVar17 = 0;
  }
  if ((uVar17 == 3) || ((env->features & 1) == 0)) {
    *physical = addr;
    *prot = 7;
    return 0;
  }
  ptVar15 = &env->vsstatus;
  if (first_stage) {
    ptVar15 = &env->mstatus;
  }
  *prot = 0;
  uVar3 = *ptVar15;
  if (0x10fff < env->priv_ver) {
    lVar16 = 0x2a0;
    if (bVar5 != 0) {
      lVar16 = 0x368;
    }
    lVar10 = 0x328;
    if (first_stage) {
      lVar10 = lVar16;
    }
    uVar3 = *(ulong *)((long)env->gpr + lVar10);
    if ((uint)(uVar3 >> 0x3c) < 0xb) {
      iVar7 = (*(code *)(&DAT_00dbac4c + *(int *)(&DAT_00dbac4c + (uVar3 >> 0x3c) * 4)))();
      return iVar7;
    }
    iVar7 = 0x17f;
    goto LAB_00c676a2;
  }
  tVar21 = env->sptbr;
  uVar2 = (uint)env->mstatus;
  uVar8 = uVar2 >> 0x18 & 0x1f;
  if (uVar8 < 9) {
    if (uVar8 == 0) {
      *physical = addr;
      *prot = 7;
      return 0;
    }
    if (uVar8 == 8) {
      local_58 = 2;
      iVar7 = 10;
      lVar16 = 4;
      goto LAB_00c6729d;
    }
LAB_00c67688:
    iVar7 = 0x192;
LAB_00c676a2:
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/riscv/cpu_helper.c"
               ,iVar7,(char *)0x0);
  }
  if (uVar8 == 10) {
    local_58 = 4;
  }
  else {
    if (uVar8 != 9) goto LAB_00c67688;
    local_58 = 3;
  }
  iVar7 = 9;
  lVar16 = 8;
LAB_00c6729d:
  cVar4 = (char)local_58 * (sbyte)iVar7;
  uVar20 = ~(-1L << (0x35U - cVar4 & 0x3f));
  uVar19 = addr >> (cVar4 + 0xbU & 0x3f) & uVar20;
  if (uVar19 != 0 && uVar19 != uVar20) {
    return 1;
  }
  uVar14 = ((int)local_58 + -1) * iVar7;
  uVar8 = (uint)(access_type == 1);
  local_68 = (ulong)(access_type == 1) << 7;
  iVar9 = 0;
  local_88 = mmu_idx;
  local_80 = addr;
  local_70 = (byte *)prot;
  local_50 = physical;
  do {
    local_a0 = tVar21 * 0x1000;
    local_78 = (ulong)uVar14;
    local_40 = local_80 >> ((byte)uVar14 + 0xc & 0x3f);
    local_60 = ~(-1L << ((byte)uVar14 & 0x3f));
    while( true ) {
      iVar18 = iVar9;
      uVar19 = (ulong)(~(-1 << (sbyte)iVar7) & (uint)local_40);
      if (first_stage && two_stage) {
        get_physical_address(env,&vbase,(int *)local_70,local_a0,access_type,local_88,false,true);
        addr_00 = uVar19 * lVar16 + vbase;
      }
      else {
        addr_00 = uVar19 * lVar16 + local_a0;
      }
      if (((env->features & 2) != 0) &&
         (_Var6 = pmp_hart_has_privs_riscv64((CPURISCVState_conflict2 *)env,addr_00,8,PMP_READ,1),
         !_Var6)) {
        return 2;
      }
      uVar11 = address_space_ldq_riscv64
                         ((uc_struct_conflict13 *)((AddressSpace *)env[-0x17].gpr[0x1d])->uc,
                          (AddressSpace *)env[-0x17].gpr[0x1d],addr_00,(MemTxAttrs)0x1,&res);
      if (res != 0) {
        return 1;
      }
      if ((uVar11 & 1) == 0) {
        return 1;
      }
      tVar21 = uVar11 >> 10;
      if ((uVar11 & 0xe) == 0) break;
      iVar9 = (int)(uVar11 & 0xe);
      if (iVar9 == 4) {
        return 1;
      }
      if (iVar9 == 0xc) {
        return 1;
      }
      if ((uVar17 == 0) || ((uVar11 & 0x10) == 0)) {
        if ((uVar17 != 1) && ((uVar11 & 0x10) == 0)) {
          return 1;
        }
      }
      else if (access_type == 2 || (uVar2 >> 0x12 & 1) != 0) {
        return 1;
      }
      if ((local_60 & tVar21) != 0) {
        return 1;
      }
      if ((access_type == 0) && ((uVar11 & 2) == 0)) {
        if ((uVar11 & 8) == 0) {
          return 1;
        }
        if ((uVar3 & 0x80000) == 0) {
          return 1;
        }
        local_48 = 0;
        uVar19 = 0;
      }
      else {
        if ((access_type == 1) && ((uVar11 & 4) == 0)) {
          return 1;
        }
        local_48 = (ulong)uVar8;
        uVar19 = local_68;
        if ((access_type == 2) && (local_48 = (ulong)uVar8, (uVar11 & 8) == 0)) {
          return 1;
        }
      }
      uVar19 = uVar19 | uVar11 | 0x40;
      uVar22 = uVar11;
      if (uVar19 == uVar11) goto LAB_00c675e5;
      vbase = 8;
      pMVar12 = flatview_translate_riscv64
                          (*(uc_struct_conflict13 **)(env[-0x17].gpr[0x1d] + 0x30),
                           *(FlatView **)(env[-0x17].gpr[0x1d] + 8),addr_00,&addr1,&vbase,false,
                           (MemTxAttrs)0x1);
      if (pMVar12->ram == false) {
        return 1;
      }
      puVar13 = (uint64_t *)
                qemu_map_ram_ptr_riscv64
                          ((uc_struct_conflict13 *)pMVar12->uc,pMVar12->ram_block,addr1);
      LOCK();
      uVar1 = *puVar13;
      if (uVar11 == uVar1) {
        *puVar13 = uVar19;
      }
      UNLOCK();
      uVar22 = uVar19;
      iVar9 = 0;
      if (uVar11 == uVar1) {
LAB_00c675e5:
        if (iVar18 == 0) {
          local_60 = ~(-1L << ((byte)local_78 & 0x3f));
        }
        *local_50 = (tVar21 | local_60 & local_80 >> 0xc) << 0xc;
        if (((uVar22 & 2) != 0) ||
           (((byte)((uVar22 & 0xffffffff) >> 3) & 0x1f & (byte)(uVar3 >> 0x13) & 1) != 0)) {
          *local_70 = *local_70 | 1;
        }
        if ((uVar22 & 8) != 0) {
          *local_70 = *local_70 | 4;
        }
        if ((uVar22 & 4) == 0) {
          return 0;
        }
        if ((~(byte)local_48 & -1 < (char)uVar22) != 0) {
          return 0;
        }
        *local_70 = *local_70 | 2;
        return 0;
      }
    }
    iVar9 = iVar18 + 1;
    uVar14 = (int)local_78 - iVar7;
    if (iVar9 == (int)local_58) {
      return 1;
    }
  } while( true );
}

Assistant:

static int get_physical_address(CPUMIPSState *env, hwaddr *physical,
                                int *prot, target_ulong real_address,
                                int rw, int access_type, int mmu_idx)
{
    /* User mode can only access useg/xuseg */
#if defined(TARGET_MIPS64)
    int user_mode = mmu_idx == MIPS_HFLAG_UM;
    int supervisor_mode = mmu_idx == MIPS_HFLAG_SM;
    int kernel_mode = !user_mode && !supervisor_mode;
    int UX = (env->CP0_Status & (1 << CP0St_UX)) != 0;
    int SX = (env->CP0_Status & (1 << CP0St_SX)) != 0;
    int KX = (env->CP0_Status & (1 << CP0St_KX)) != 0;
#endif
    int ret = TLBRET_MATCH;
    /* effective address (modified for KVM T&E kernel segments) */
    target_ulong address = real_address;

#define USEG_LIMIT      ((target_ulong)(int32_t)0x7FFFFFFFUL)
#define KSEG0_BASE      ((target_ulong)(int32_t)0x80000000UL)
#define KSEG1_BASE      ((target_ulong)(int32_t)0xA0000000UL)
#define KSEG2_BASE      ((target_ulong)(int32_t)0xC0000000UL)
#define KSEG3_BASE      ((target_ulong)(int32_t)0xE0000000UL)

#define KVM_KSEG0_BASE  ((target_ulong)(int32_t)0x40000000UL)
#define KVM_KSEG2_BASE  ((target_ulong)(int32_t)0x60000000UL)

#if 0
    if (mips_um_ksegs_enabled()) {
        /* KVM T&E adds guest kernel segments in useg */
        if (real_address >= KVM_KSEG0_BASE) {
            if (real_address < KVM_KSEG2_BASE) {
                /* kseg0 */
                address += KSEG0_BASE - KVM_KSEG0_BASE;
            } else if (real_address <= USEG_LIMIT) {
                /* kseg2/3 */
                address += KSEG2_BASE - KVM_KSEG2_BASE;
            }
        }
    }
#endif

    if (address <= USEG_LIMIT) {
        /* useg */
        uint16_t segctl;

        if (address >= 0x40000000UL) {
            segctl = env->CP0_SegCtl2;
        } else {
            segctl = env->CP0_SegCtl2 >> 16;
        }
        ret = get_segctl_physical_address(env, physical, prot,
                                          real_address, rw, access_type,
                                          mmu_idx, segctl, 0x3FFFFFFF);
#if defined(TARGET_MIPS64)
    } else if (address < 0x4000000000000000ULL) {
        /* xuseg */
        if (UX && address <= (0x3FFFFFFFFFFFFFFFULL & env->SEGMask)) {
            ret = env->tlb->map_address(env, physical, prot,
                                        real_address, rw, access_type);
        } else {
            ret = TLBRET_BADADDR;
        }
    } else if (address < 0x8000000000000000ULL) {
        /* xsseg */
        if ((supervisor_mode || kernel_mode) &&
            SX && address <= (0x7FFFFFFFFFFFFFFFULL & env->SEGMask)) {
            ret = env->tlb->map_address(env, physical, prot,
                                        real_address, rw, access_type);
        } else {
            ret = TLBRET_BADADDR;
        }
    } else if (address < 0xC000000000000000ULL) {
        /* xkphys */
        if ((address & 0x07FFFFFFFFFFFFFFULL) <= env->PAMask) {
            /* KX/SX/UX bit to check for each xkphys EVA access mode */
            static const uint8_t am_ksux[8] = {
                [CP0SC_AM_UK]    = (1u << CP0St_KX),
                [CP0SC_AM_MK]    = (1u << CP0St_KX),
                [CP0SC_AM_MSK]   = (1u << CP0St_SX),
                [CP0SC_AM_MUSK]  = (1u << CP0St_UX),
                [CP0SC_AM_MUSUK] = (1u << CP0St_UX),
                [CP0SC_AM_USK]   = (1u << CP0St_SX),
                [6]              = (1u << CP0St_KX),
                [CP0SC_AM_UUSK]  = (1u << CP0St_UX),
            };
            unsigned int am = CP0SC_AM_UK;
            unsigned int xr = (env->CP0_SegCtl2 & CP0SC2_XR_MASK) >> CP0SC2_XR;

            if (xr & (1 << ((address >> 59) & 0x7))) {
                am = (env->CP0_SegCtl1 & CP0SC1_XAM_MASK) >> CP0SC1_XAM;
            }
            /* Does CP0_Status.KX/SX/UX permit the access mode (am) */
            if (env->CP0_Status & am_ksux[am]) {
                ret = get_seg_physical_address(env, physical, prot,
                                               real_address, rw, access_type,
                                               mmu_idx, am, false, env->PAMask,
                                               0);
            } else {
                ret = TLBRET_BADADDR;
            }
        } else {
            ret = TLBRET_BADADDR;
        }
    } else if (address < 0xFFFFFFFF80000000ULL) {
        /* xkseg */
        if (kernel_mode && KX &&
            address <= (0xFFFFFFFF7FFFFFFFULL & env->SEGMask)) {
            ret = env->tlb->map_address(env, physical, prot,
                                        real_address, rw, access_type);
        } else {
            ret = TLBRET_BADADDR;
        }
#endif
    } else if (address < KSEG1_BASE) {
        /* kseg0 */
        ret = get_segctl_physical_address(env, physical, prot, real_address, rw,
                                          access_type, mmu_idx,
                                          env->CP0_SegCtl1 >> 16, 0x1FFFFFFF);
    } else if (address < KSEG2_BASE) {
        /* kseg1 */
        ret = get_segctl_physical_address(env, physical, prot, real_address, rw,
                                          access_type, mmu_idx,
                                          env->CP0_SegCtl1, 0x1FFFFFFF);
    } else if (address < KSEG3_BASE) {
        /* sseg (kseg2) */
        ret = get_segctl_physical_address(env, physical, prot, real_address, rw,
                                          access_type, mmu_idx,
                                          env->CP0_SegCtl0 >> 16, 0x1FFFFFFF);
    } else {
        /*
         * kseg3
         * XXX: debug segment is not emulated
         */
        ret = get_segctl_physical_address(env, physical, prot, real_address, rw,
                                          access_type, mmu_idx,
                                          env->CP0_SegCtl0, 0x1FFFFFFF);
    }
    return ret;
}